

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh_asn1.cc
# Opt level: O3

dh_st * EVP_PKEY_get1_DH(EVP_PKEY *pkey)

{
  DH *dh;
  
  if (pkey->save_type == 0x1c) {
    dh = *(DH **)&pkey->references;
    if (dh == (DH *)0x0) {
      dh = (DH *)0x0;
    }
    else {
      DH_up_ref(dh);
    }
  }
  else {
    dh = (DH *)0x0;
    ERR_put_error(6,0,0x8a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh_asn1.cc"
                  ,0x82);
  }
  return dh;
}

Assistant:

DH *EVP_PKEY_get1_DH(const EVP_PKEY *pkey) {
  DH *dh = EVP_PKEY_get0_DH(pkey);
  if (dh != NULL) {
    DH_up_ref(dh);
  }
  return dh;
}